

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid_checker.cpp
# Opt level: O2

string * __thiscall
duckdb::ValidChecker::InvalidatedMessage_abi_cxx11_
          (string *__return_storage_ptr__,ValidChecker *this)

{
  ::std::mutex::lock(&this->invalidate_lock);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->invalidated_msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

string ValidChecker::InvalidatedMessage() {
	lock_guard<mutex> l(invalidate_lock);
	return invalidated_msg;
}